

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.hpp
# Opt level: O2

void __thiscall
cs::statement_function::statement_function
          (statement_function *this,string *name,string *decl,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *body,
          bool is_override,bool is_vargs,context_t *c,token_base *ptr)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> local_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d0;
  __shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> local_b8;
  string local_a0;
  _Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> local_80;
  
  std::__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_b8,&c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>);
  _Var1._M_pi = local_b8._M_refcount._M_pi;
  (this->super_statement_base)._vptr_statement_base = (_func_int **)&PTR__statement_base_00249528;
  local_b8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_statement_base).context.
  super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_b8._M_ptr;
  (this->super_statement_base).context.
  super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi;
  local_b8._M_ptr = (element_type *)0x0;
  (this->super_statement_base).line_num = ptr->line_num;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b8._M_refcount);
  (this->super_statement_base)._vptr_statement_base =
       (_func_int **)&PTR__statement_function_0024a778;
  std::__cxx11::string::string((string *)&this->mName,(string *)name);
  std::__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_e0,&c->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>);
  std::__cxx11::string::string((string *)&local_a0,(string *)decl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_d0,args);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_80,body);
  cs::function::function
            (&this->mFunc,(context_t *)&local_e0,&local_a0,&this->super_statement_base,&local_d0,
             (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)&local_80,
             is_vargs,false);
  std::_Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::~_Deque_base
            (&local_80);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_e0._M_refcount);
  this->mOverride = is_override;
  this->mIsMemFn = false;
  std::__cxx11::string::string((string *)&this->mDecl,(string *)decl);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->mArgs,args);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque(&this->mBlock,body)
  ;
  return;
}

Assistant:

statement_function(std::string name, const std::string &decl, const std::vector<std::string> &args,
		                   const std::deque<statement_base *> &body, bool is_override, bool is_vargs,
		                   const context_t &c,
		                   token_base *ptr)
			: statement_base(c, ptr), mName(std::move(name)), mFunc(c, decl, this, args, body, is_vargs),
			  mOverride(is_override), mDecl(decl), mArgs(args), mBlock(body) {}